

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

opj_image_t * tiftoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_BOOL OVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  size_t __size;
  void *pvVar9;
  OPJ_INT32 **__ptr;
  ulong uVar10;
  bool bVar11;
  bool local_1b1;
  uint local_190;
  uint local_18c;
  bool local_179;
  long local_178;
  int64_t ssize;
  OPJ_UINT8 *dat8;
  OPJ_INT32 *planes [4];
  OPJ_INT32 *buffer32s;
  convert_32s_CXPX cvtCxToPx;
  convert_XXx32s_C1R cvtTifTo32s;
  OPJ_BOOL is_cinema;
  uint32 tiHeight;
  uint32 tiWidth;
  ushort local_114;
  uint16 tiPC;
  uint16 tiSpp;
  uint16 tiSf;
  uint16 tiPhoto;
  uint16 tiBps;
  opj_image_t *image;
  opj_image_cmptparm_t cmptparm [4];
  undefined4 local_70;
  uint local_6c;
  OPJ_COLOR_SPACE color_space;
  int h;
  int w;
  int numcomps;
  int currentPlane;
  int j;
  int64_t TIFF_MAX;
  int64_t rowStride;
  int64_t strip_size;
  tstrip_t strip;
  tdata_t buf;
  TIFF *tif;
  int subsampling_dy;
  int subsampling_dx;
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  OVar1 = parameters->subsampling_dx;
  OVar2 = parameters->subsampling_dy;
  local_70 = 0xffffffff;
  _tiSpp = (uint *)0x0;
  local_179 = false;
  if (2 < parameters->rsiz) {
    local_179 = parameters->rsiz < 7;
  }
  cvtTifTo32s._0_4_ = (uint)local_179;
  cvtCxToPx = (convert_32s_CXPX)0x0;
  lVar8 = TIFFOpen(filename,"r");
  if (lVar8 == 0) {
    fprintf(_stderr,"tiftoimage:Failed to open %s for reading\n",filename);
    filename_local = (char *)0x0;
  }
  else {
    tiHeight._2_2_ = 0;
    tiWidth._0_2_ = 0;
    tiWidth._2_2_ = 0;
    local_114 = 0;
    tiPC = 0;
    cvtTifTo32s._4_4_ = 0;
    is_cinema = 0;
    TIFFGetField(lVar8,0x100,&is_cinema);
    TIFFGetField(lVar8,0x101,(long)&cvtTifTo32s + 4);
    TIFFGetField(lVar8,0x102,&tiPC);
    TIFFGetField(lVar8,0x153,(long)&tiWidth + 2);
    TIFFGetField(lVar8,0x115,&tiWidth);
    TIFFGetField(lVar8,0x106,&local_114);
    TIFFGetField(lVar8,0x11c,(long)&tiHeight + 2);
    OVar3 = is_cinema;
    uVar7 = cvtTifTo32s._4_4_;
    if (((ushort)tiWidth == 0) || (4 < (ushort)tiWidth)) {
      fprintf(_stderr,"tiftoimage: Bad value for samples per pixel == %d.\n\tAborting.\n",
              (ulong)(ushort)tiWidth);
      TIFFClose(lVar8);
      filename_local = (char *)0x0;
    }
    else if ((tiPC < 0x11) && (tiPC != 0)) {
      if ((local_114 == 1) || (local_114 == 2)) {
        if ((is_cinema == 0) || (cvtTifTo32s._4_4_ == 0)) {
          fprintf(_stderr,"tiftoimage: Bad values for width(%u) and/or height(%u)\n\tAborting.\n",
                  (ulong)(uint)is_cinema,(ulong)cvtTifTo32s._4_4_);
          TIFFClose(lVar8);
          filename_local = (char *)0x0;
        }
        else {
          switch(tiPC) {
          case 1:
          case 2:
          case 4:
          case 6:
          case 8:
            cvtCxToPx = (convert_32s_CXPX)convert_XXu32s_C1R_LUT[tiPC];
            break;
          case 3:
            cvtCxToPx = tif_3uto32s;
            break;
          case 5:
            cvtCxToPx = tif_5uto32s;
            break;
          case 7:
            cvtCxToPx = tif_7uto32s;
            break;
          case 9:
            cvtCxToPx = tif_9uto32s;
            break;
          case 10:
            cvtCxToPx = tif_10uto32s;
            break;
          case 0xb:
            cvtCxToPx = tif_11uto32s;
            break;
          case 0xc:
            cvtCxToPx = tif_12uto32s;
            break;
          case 0xd:
            cvtCxToPx = tif_13uto32s;
            break;
          case 0xe:
            cvtCxToPx = tif_14uto32s;
            break;
          case 0xf:
            cvtCxToPx = tif_15uto32s;
            break;
          case 0x10:
            cvtCxToPx = tif_16uto32s;
          }
          memset(&image,0,0x90);
          if (((local_114 == 2) && ((uint)cvtTifTo32s != 0)) && (tiPC != 0xc)) {
            fprintf(_stdout,
                    "WARNING:\nInput image bitdepth is %d bits\nTIF conversion has automatically rescaled to 12-bits\nto comply with cinema profiles.\n"
                    ,(ulong)tiPC);
          }
          else {
            cvtTifTo32s._0_4_ = 0;
          }
          uVar4 = (ushort)tiWidth;
          uVar5 = (uint)(ushort)tiWidth;
          if (local_114 == 2) {
            local_70 = 1;
          }
          else if (local_114 == 1) {
            local_70 = 2;
          }
          buffer32s = (OPJ_INT32 *)convert_32s_CXPX_LUT[(int)uVar5];
          if (tiHeight._2_2_ == 2) {
            buffer32s = (OPJ_INT32 *)convert_32s_C1P1;
            tiWidth._0_2_ = 1;
          }
          for (numcomps = 0; numcomps < (int)uVar5; numcomps = numcomps + 1) {
            cmptparm[numcomps].x0 = (uint)tiPC;
            cmptparm[numcomps].y0 = (uint)tiPC;
            cmptparm[(long)numcomps + -1].bpp = OVar1;
            cmptparm[(long)numcomps + -1].sgnd = OVar2;
            cmptparm[numcomps].dx = OVar3;
            cmptparm[numcomps].dy = uVar7;
          }
          _tiSpp = (uint *)opj_image_create(uVar5,&image,local_70);
          if (_tiSpp == (uint *)0x0) {
            TIFFClose(lVar8);
            filename_local = (char *)0x0;
          }
          else {
            *_tiSpp = parameters->image_offset_x0;
            _tiSpp[1] = parameters->image_offset_y0;
            if (*_tiSpp == 0) {
              iVar6 = (OVar3 + -1) * OVar1;
            }
            else {
              iVar6 = *_tiSpp + (OVar3 + -1) * OVar1;
            }
            local_18c = iVar6 + 1;
            _tiSpp[2] = local_18c;
            if (*_tiSpp < _tiSpp[2]) {
              if (_tiSpp[1] == 0) {
                iVar6 = (uVar7 - 1) * OVar2;
              }
              else {
                iVar6 = _tiSpp[1] + (uVar7 - 1) * OVar2;
              }
              local_190 = iVar6 + 1;
              _tiSpp[3] = local_190;
              if (_tiSpp[1] < _tiSpp[3]) {
                for (numcomps = 0; numcomps < (int)uVar5; numcomps = numcomps + 1) {
                  planes[(long)numcomps + -1] =
                       *(OPJ_INT32 **)(*(long *)(_tiSpp + 6) + (long)numcomps * 0x40 + 0x30);
                }
                *(ushort *)(*(long *)(_tiSpp + 6) + (long)(int)(uVar5 - 1) * 0x40 + 0x38) =
                     1 - (uVar4 & 1);
                __size = TIFFStripSize(lVar8);
                pvVar9 = malloc(__size);
                if (pvVar9 == (void *)0x0) {
                  TIFFClose(lVar8);
                  opj_image_destroy(_tiSpp);
                  filename_local = (char *)0x0;
                }
                else {
                  uVar10 = 0xffffffff % (ulong)(ushort)tiWidth;
                  if (((0xffffffff / (ulong)(ushort)tiWidth < (ulong)(uint)is_cinema) ||
                      (uVar10 = 0xffffffff % (ulong)tiPC,
                      0xffffffff / (ulong)tiPC < (ulong)(is_cinema * (uint)(ushort)tiWidth))) ||
                     (uVar10 = 3, 0x3fffffff < is_cinema * (uint)(ushort)tiWidth)) {
                    fprintf(_stderr,"Buffer overflow\n",uVar10);
                    _TIFFfree(pvVar9);
                    TIFFClose(lVar8);
                    opj_image_destroy(_tiSpp);
                    filename_local = (char *)0x0;
                  }
                  else {
                    uVar10 = (ulong)(is_cinema * (uint)(ushort)tiWidth * (uint)tiPC + 7 >> 3);
                    __ptr = (OPJ_INT32 **)
                            malloc((ulong)(uint)is_cinema * 4 * (ulong)(ushort)tiWidth);
                    if (__ptr == (OPJ_INT32 **)0x0) {
                      _TIFFfree(pvVar9);
                      TIFFClose(lVar8);
                      opj_image_destroy(_tiSpp);
                      filename_local = (char *)0x0;
                    }
                    else {
                      strip_size._4_4_ = 0;
                      w = 0;
                      do {
                        dat8 = *(OPJ_UINT8 **)(*(long *)(_tiSpp + 6) + (long)w * 0x40 + 0x30);
                        local_6c = cvtTifTo32s._4_4_;
                        while( true ) {
                          bVar11 = false;
                          if (0 < (int)local_6c) {
                            uVar7 = TIFFNumberOfStrips(lVar8);
                            bVar11 = strip_size._4_4_ < uVar7;
                          }
                          if (!bVar11) break;
                          local_178 = TIFFReadEncodedStrip(lVar8,strip_size._4_4_,pvVar9,__size);
                          if ((local_178 < 1) || (ssize = (int64_t)pvVar9, (long)__size < local_178)
                             ) {
                            fprintf(_stderr,
                                    "tiftoimage: Bad value for ssize(%ld) vs. strip_size(%ld).\n\tAborting.\n"
                                    ,local_178,__size);
                            _TIFFfree(pvVar9);
                            _TIFFfree(__ptr);
                            TIFFClose(lVar8);
                            opj_image_destroy(_tiSpp);
                            return (opj_image_t *)0x0;
                          }
                          for (; (long)uVar10 <= local_178; local_178 = local_178 - uVar10) {
                            (*cvtCxToPx)((OPJ_INT32 *)ssize,__ptr,
                                         (long)OVar3 * (ulong)(ushort)tiWidth);
                            (*(code *)buffer32s)(__ptr,&dat8,(long)OVar3);
                            dat8 = dat8 + (long)OVar3 * 4;
                            planes[0] = planes[0] + OVar3;
                            planes[1] = planes[1] + OVar3;
                            planes[2] = planes[2] + OVar3;
                            local_6c = local_6c - 1;
                            ssize = uVar10 + ssize;
                          }
                          strip_size._4_4_ = strip_size._4_4_ + 1;
                        }
                        w = w + 1;
                        local_1b1 = tiHeight._2_2_ == 2 && w < (int)uVar5;
                      } while (local_1b1);
                      free(__ptr);
                      _TIFFfree(pvVar9);
                      TIFFClose(lVar8);
                      if ((uint)cvtTifTo32s != 0) {
                        for (numcomps = 0; numcomps < (int)uVar5; numcomps = numcomps + 1) {
                          scale_component((opj_image_comp_t *)
                                          (*(long *)(_tiSpp + 6) + (long)numcomps * 0x40),0xc);
                        }
                      }
                      filename_local = (char *)_tiSpp;
                    }
                  }
                }
              }
              else {
                fprintf(_stderr,
                        "tiftoimage: Bad value for image->y1(%d) vs. image->y0(%d)\n\tAborting.\n",
                        (ulong)_tiSpp[3],(ulong)_tiSpp[1]);
                TIFFClose(lVar8);
                opj_image_destroy(_tiSpp);
                filename_local = (char *)0x0;
              }
            }
            else {
              fprintf(_stderr,
                      "tiftoimage: Bad value for image->x1(%d) vs. image->x0(%d)\n\tAborting.\n",
                      (ulong)_tiSpp[2],(ulong)*_tiSpp);
              TIFFClose(lVar8);
              opj_image_destroy(_tiSpp);
              filename_local = (char *)0x0;
            }
          }
        }
      }
      else {
        fprintf(_stderr,
                "tiftoimage: Bad color format %d.\n\tOnly RGB(A) and GRAY(A) has been implemented\n\tAborting.\n"
                ,(ulong)local_114);
        TIFFClose(lVar8);
        filename_local = (char *)0x0;
      }
    }
    else {
      fprintf(_stderr,
              "tiftoimage: Bad values for Bits == %d.\n\tMax. 16 Bits are allowed here.\n\tAborting.\n"
              ,(ulong)tiPC);
      TIFFClose(lVar8);
      filename_local = (char *)0x0;
    }
  }
  return (opj_image_t *)filename_local;
}

Assistant:

opj_image_t* tiftoimage(const char *filename, opj_cparameters_t *parameters)
{
    int subsampling_dx = parameters->subsampling_dx;
    int subsampling_dy = parameters->subsampling_dy;
    TIFF *tif;
    tdata_t buf;
    tstrip_t strip;
    int64_t strip_size, rowStride, TIFF_MAX;
    int j, currentPlane, numcomps = 0, w, h;
    OPJ_COLOR_SPACE color_space = OPJ_CLRSPC_UNKNOWN;
    opj_image_cmptparm_t cmptparm[4]; /* RGBA */
    opj_image_t *image = NULL;
    uint16 tiBps, tiPhoto, tiSf, tiSpp, tiPC;
    uint32 tiWidth, tiHeight;
    OPJ_BOOL is_cinema = OPJ_IS_CINEMA(parameters->rsiz);
    convert_XXx32s_C1R cvtTifTo32s = NULL;
    convert_32s_CXPX cvtCxToPx = NULL;
    OPJ_INT32* buffer32s = NULL;
    OPJ_INT32* planes[4];

    tif = TIFFOpen(filename, "r");

    if (!tif) {
        fprintf(stderr, "tiftoimage:Failed to open %s for reading\n", filename);
        return 0;
    }
    tiBps = tiPhoto = tiSf = tiSpp = tiPC = 0;
    tiWidth = tiHeight = 0;

    TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &tiWidth);
    TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &tiHeight);
    TIFFGetField(tif, TIFFTAG_BITSPERSAMPLE, &tiBps);
    TIFFGetField(tif, TIFFTAG_SAMPLEFORMAT, &tiSf);
    TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &tiSpp);
    TIFFGetField(tif, TIFFTAG_PHOTOMETRIC, &tiPhoto);
    TIFFGetField(tif, TIFFTAG_PLANARCONFIG, &tiPC);
    w = (int)tiWidth;
    h = (int)tiHeight;

    if (tiSpp == 0 || tiSpp > 4) { /* should be 1 ... 4 */
        fprintf(stderr, "tiftoimage: Bad value for samples per pixel == %d.\n"
                "\tAborting.\n", tiSpp);
        TIFFClose(tif);
        return NULL;
    }
    if (tiBps > 16U || tiBps == 0) {
        fprintf(stderr, "tiftoimage: Bad values for Bits == %d.\n"
                "\tMax. 16 Bits are allowed here.\n\tAborting.\n", tiBps);
        TIFFClose(tif);
        return NULL;
    }
    if (tiPhoto != PHOTOMETRIC_MINISBLACK && tiPhoto != PHOTOMETRIC_RGB) {
        fprintf(stderr,
                "tiftoimage: Bad color format %d.\n\tOnly RGB(A) and GRAY(A) has been implemented\n\tAborting.\n",
                (int) tiPhoto);
        TIFFClose(tif);
        return NULL;
    }
    if (tiWidth == 0 || tiHeight == 0) {
        fprintf(stderr, "tiftoimage: Bad values for width(%u) "
                "and/or height(%u)\n\tAborting.\n", tiWidth, tiHeight);
        TIFFClose(tif);
        return NULL;
    }
    w = (int)tiWidth;
    h = (int)tiHeight;

    switch (tiBps) {
    case 1:
    case 2:
    case 4:
    case 6:
    case 8:
        cvtTifTo32s = convert_XXu32s_C1R_LUT[tiBps];
        break;
    /* others are specific to TIFF */
    case 3:
        cvtTifTo32s = tif_3uto32s;
        break;
    case 5:
        cvtTifTo32s = tif_5uto32s;
        break;
    case 7:
        cvtTifTo32s = tif_7uto32s;
        break;
    case 9:
        cvtTifTo32s = tif_9uto32s;
        break;
    case 10:
        cvtTifTo32s = tif_10uto32s;
        break;
    case 11:
        cvtTifTo32s = tif_11uto32s;
        break;
    case 12:
        cvtTifTo32s = tif_12uto32s;
        break;
    case 13:
        cvtTifTo32s = tif_13uto32s;
        break;
    case 14:
        cvtTifTo32s = tif_14uto32s;
        break;
    case 15:
        cvtTifTo32s = tif_15uto32s;
        break;
    case 16:
        cvtTifTo32s = (convert_XXx32s_C1R)tif_16uto32s;
        break;
    default:
        /* never here */
        break;
    }

    /* initialize image components */
    memset(&cmptparm[0], 0, 4 * sizeof(opj_image_cmptparm_t));

    if ((tiPhoto == PHOTOMETRIC_RGB) && (is_cinema) && (tiBps != 12U)) {
        fprintf(stdout, "WARNING:\n"
                "Input image bitdepth is %d bits\n"
                "TIF conversion has automatically rescaled to 12-bits\n"
                "to comply with cinema profiles.\n",
                tiBps);
    } else {
        is_cinema = 0U;
    }

    numcomps = tiSpp;
    if (tiPhoto == PHOTOMETRIC_RGB) { /* RGB(A) */
        color_space = OPJ_CLRSPC_SRGB;
    } else if (tiPhoto == PHOTOMETRIC_MINISBLACK) { /* GRAY(A) */
        color_space = OPJ_CLRSPC_GRAY;
    }

    cvtCxToPx = convert_32s_CXPX_LUT[numcomps];
    if (tiPC == PLANARCONFIG_SEPARATE) {
        cvtCxToPx = convert_32s_CXPX_LUT[1]; /* override */
        tiSpp = 1U; /* consider only one sample per plane */
    }

    for (j = 0; j < numcomps; j++) {
        cmptparm[j].prec = tiBps;
        cmptparm[j].bpp = tiBps;
        cmptparm[j].dx = (OPJ_UINT32)subsampling_dx;
        cmptparm[j].dy = (OPJ_UINT32)subsampling_dy;
        cmptparm[j].w = (OPJ_UINT32)w;
        cmptparm[j].h = (OPJ_UINT32)h;
    }

    image = opj_image_create((OPJ_UINT32)numcomps, &cmptparm[0], color_space);
    if (!image) {
        TIFFClose(tif);
        return NULL;
    }
    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = !image->x0 ? (OPJ_UINT32)(w - 1) * (OPJ_UINT32)subsampling_dx + 1 :
                image->x0 + (OPJ_UINT32)(w - 1) * (OPJ_UINT32)subsampling_dx + 1;
    if (image->x1 <= image->x0) {
        fprintf(stderr, "tiftoimage: Bad value for image->x1(%d) vs. "
                "image->x0(%d)\n\tAborting.\n", image->x1, image->x0);
        TIFFClose(tif);
        opj_image_destroy(image);
        return NULL;
    }
    image->y1 = !image->y0 ? (OPJ_UINT32)(h - 1) * (OPJ_UINT32)subsampling_dy + 1 :
                image->y0 + (OPJ_UINT32)(h - 1) * (OPJ_UINT32)subsampling_dy + 1;
    if (image->y1 <= image->y0) {
        fprintf(stderr, "tiftoimage: Bad value for image->y1(%d) vs. "
                "image->y0(%d)\n\tAborting.\n", image->y1, image->y0);
        TIFFClose(tif);
        opj_image_destroy(image);
        return NULL;
    }

    for (j = 0; j < numcomps; j++) {
        planes[j] = image->comps[j].data;
    }
    image->comps[numcomps - 1].alpha = (OPJ_UINT16)(1 - (numcomps & 1));

    strip_size = (int64_t)TIFFStripSize(tif);

    buf = malloc((OPJ_SIZE_T)strip_size);
    if (buf == NULL) {
        TIFFClose(tif);
        opj_image_destroy(image);
        return NULL;
    }
    if (sizeof(tsize_t) == 4) {
        TIFF_MAX = INT_MAX;
    } else {
        TIFF_MAX = UINT_MAX;
    }
    if ((int64_t)tiWidth > (int64_t)(TIFF_MAX / tiSpp) ||
            (int64_t)(tiWidth * tiSpp) > (int64_t)(TIFF_MAX / tiBps) ||
            (int64_t)(tiWidth * tiSpp) > (int64_t)(TIFF_MAX / (int64_t)sizeof(OPJ_INT32))) {
        fprintf(stderr, "Buffer overflow\n");
        _TIFFfree(buf);
        TIFFClose(tif);
        opj_image_destroy(image);
        return NULL;
    }

    rowStride = (int64_t)((tiWidth * tiSpp * tiBps + 7U) / 8U);
    buffer32s = (OPJ_INT32 *)malloc(sizeof(OPJ_INT32) * tiWidth * tiSpp);
    if (buffer32s == NULL) {
        _TIFFfree(buf);
        TIFFClose(tif);
        opj_image_destroy(image);
        return NULL;
    }

    strip = 0;
    currentPlane = 0;
    do {
        planes[0] = image->comps[currentPlane].data; /* to manage planar data */
        h = (int)tiHeight;
        /* Read the Image components */
        for (; (h > 0) && (strip < TIFFNumberOfStrips(tif)); strip++) {
            const OPJ_UINT8 *dat8;
            int64_t ssize;

            ssize = (int64_t)TIFFReadEncodedStrip(tif, strip, buf, (tsize_t)strip_size);

            if (ssize < 1 || ssize > strip_size) {
                fprintf(stderr, "tiftoimage: Bad value for ssize(%" PRId64 ") "
                        "vs. strip_size(%" PRId64 ").\n\tAborting.\n", ssize, strip_size);
                _TIFFfree(buf);
                _TIFFfree(buffer32s);
                TIFFClose(tif);
                opj_image_destroy(image);
                return NULL;
            }
            dat8 = (const OPJ_UINT8*)buf;

            while (ssize >= rowStride) {
                cvtTifTo32s(dat8, buffer32s, (OPJ_SIZE_T)w * tiSpp);
                cvtCxToPx(buffer32s, planes, (OPJ_SIZE_T)w);
                planes[0] += w;
                planes[1] += w;
                planes[2] += w;
                planes[3] += w;
                dat8  += rowStride;
                ssize -= rowStride;
                h--;
            }
        }
        currentPlane++;
    } while ((tiPC == PLANARCONFIG_SEPARATE) && (currentPlane < numcomps));

    free(buffer32s);
    _TIFFfree(buf);
    TIFFClose(tif);

    if (is_cinema) {
        for (j = 0; j < numcomps; ++j) {
            scale_component(&(image->comps[j]), 12);
        }

    }
    return image;

}